

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O1

void __thiscall soinn::ESOINN::load(ESOINN *this,string *filename)

{
  xml_iarchive ia;
  ifstream ifs;
  nvp<soinn::ESOINN> local_2b8;
  xml_iarchive local_2a8;
  istream local_218 [520];
  
  boost::
  adj_list_impl<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>_>
  ::clear(&(this->graph).super_type);
  this->numberOfClasses = 0;
  std::ifstream::ifstream(local_218,(filename->_M_dataplus)._M_p,_S_in);
  boost::archive::xml_iarchive::xml_iarchive(&local_2a8,local_218,0);
  local_2b8.n_ = "*const_cast<ESOINN*>(this)";
  local_2b8.v_ = this;
  boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::load_override<soinn::ESOINN>
            ((basic_xml_iarchive<boost::archive::xml_iarchive> *)&local_2a8,&local_2b8);
  boost::archive::xml_iarchive_impl<boost::archive::xml_iarchive>::~xml_iarchive_impl
            (&local_2a8.super_xml_iarchive_impl<boost::archive::xml_iarchive>);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void ESOINN::load(std::string filename)
{
    clear();
    std::ifstream ifs(filename.c_str());
    boost::archive::xml_iarchive ia(ifs);
    ia >> BOOST_SERIALIZATION_NVP(*const_cast<ESOINN*>(this));
}